

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::ResultBuilder
          (ResultBuilder *this,IRunContext *runContext,char *macroName,SourceLineInfo *lineInfo,
          char *capturedExpression,Flags resultDisposition,char *secondArg)

{
  char *pcVar1;
  char *_lineInfo;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  Catch local_90 [55];
  allocator local_59;
  string local_58 [36];
  Flags local_34;
  char *pcStack_30;
  Flags resultDisposition_local;
  char *capturedExpression_local;
  SourceLineInfo *lineInfo_local;
  char *macroName_local;
  IRunContext *runContext_local;
  ResultBuilder *this_local;
  
  this->m_runContext = runContext;
  local_34 = resultDisposition;
  pcStack_30 = capturedExpression;
  capturedExpression_local = (char *)lineInfo;
  lineInfo_local = (SourceLineInfo *)macroName;
  macroName_local = (char *)runContext;
  runContext_local = (IRunContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,macroName,&local_59);
  _lineInfo = capturedExpression_local;
  pcVar1 = pcStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,secondArg,&local_d9);
  capturedExpressionWithSecondArgument(local_90,(string *)local_b0,(string *)local_d8);
  AssertionInfo::AssertionInfo
            (&this->m_assertionInfo,(string *)local_58,(SourceLineInfo *)_lineInfo,
             (string *)local_90,local_34);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  AssertionResultData::AssertionResultData(&this->m_data);
  ExprComponents::ExprComponents(&this->m_exprComponents);
  CopyableStream::CopyableStream(&this->m_stream);
  this->m_shouldDebugBreak = false;
  this->m_shouldThrow = false;
  return;
}

Assistant:

ResultBuilder::ResultBuilder
        (   IRunContext& runContext,
            char const* macroName,
            SourceLineInfo const& lineInfo,
            char const* capturedExpression,
            ResultDisposition::Flags resultDisposition,
            char const* secondArg )
    :   m_runContext( runContext ),
        m_assertionInfo( macroName, lineInfo, capturedExpressionWithSecondArgument( capturedExpression, secondArg ), resultDisposition ),
        m_shouldDebugBreak( false ),
        m_shouldThrow( false )
    {}